

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_ecdsa_sig_serialize(uchar *sig,size_t *size,secp256k1_scalar *ar,secp256k1_scalar *as)

{
  bool bVar1;
  ulong local_a8;
  size_t lenS;
  size_t lenR;
  uchar *sp;
  uchar *rp;
  uchar s [33];
  uchar local_58;
  uchar local_57 [7];
  uchar r [33];
  secp256k1_scalar *as_local;
  secp256k1_scalar *ar_local;
  size_t *size_local;
  uchar *sig_local;
  
  unique0x10000126 = as;
  memset(&local_58,0,0x21);
  memset(&rp,0,0x21);
  sp = &local_58;
  lenR = (size_t)&rp;
  lenS = 0x21;
  local_a8 = 0x21;
  secp256k1_scalar_get_b32(local_57,ar);
  secp256k1_scalar_get_b32((uchar *)((long)&rp + 1),stack0xffffffffffffffd0);
  while( true ) {
    bVar1 = false;
    if ((1 < lenS) && (bVar1 = false, *sp == '\0')) {
      bVar1 = sp[1] < 0x80;
    }
    if (!bVar1) break;
    lenS = lenS - 1;
    sp = sp + 1;
  }
  while( true ) {
    bVar1 = false;
    if ((1 < local_a8) && (bVar1 = false, *(char *)lenR == '\0')) {
      bVar1 = *(byte *)(lenR + 1) < 0x80;
    }
    if (!bVar1) break;
    local_a8 = local_a8 - 1;
    lenR = lenR + 1;
  }
  bVar1 = local_a8 + 6 + lenS <= *size;
  if (bVar1) {
    *size = local_a8 + 6 + lenS;
    *sig = '0';
    sig[1] = (uchar)local_a8 + '\x04' + (uchar)lenS;
    sig[2] = '\x02';
    sig[3] = (uchar)lenS;
    memcpy(sig + 4,sp,lenS);
    sig[lenS + 4] = '\x02';
    sig[lenS + 5] = (uchar)local_a8;
    memcpy(sig + lenS + 6,(void *)lenR,local_a8);
  }
  else {
    *size = local_a8 + 6 + lenS;
  }
  sig_local._4_4_ = (uint)bVar1;
  return sig_local._4_4_;
}

Assistant:

static int secp256k1_ecdsa_sig_serialize(unsigned char *sig, size_t *size, const secp256k1_scalar* ar, const secp256k1_scalar* as) {
    unsigned char r[33] = {0}, s[33] = {0};
    unsigned char *rp = r, *sp = s;
    size_t lenR = 33, lenS = 33;
    secp256k1_scalar_get_b32(&r[1], ar);
    secp256k1_scalar_get_b32(&s[1], as);
    while (lenR > 1 && rp[0] == 0 && rp[1] < 0x80) { lenR--; rp++; }
    while (lenS > 1 && sp[0] == 0 && sp[1] < 0x80) { lenS--; sp++; }
    if (*size < 6+lenS+lenR) {
        *size = 6 + lenS + lenR;
        return 0;
    }
    *size = 6 + lenS + lenR;
    sig[0] = 0x30;
    sig[1] = 4 + lenS + lenR;
    sig[2] = 0x02;
    sig[3] = lenR;
    memcpy(sig+4, rp, lenR);
    sig[4+lenR] = 0x02;
    sig[5+lenR] = lenS;
    memcpy(sig+lenR+6, sp, lenS);
    return 1;
}